

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

BasicBlock * __thiscall FlowGraph::SetBlockTargetAndLoopFlag(FlowGraph *this,LabelInstr *labelInstr)

{
  BasicBlock *block;
  
  block = labelInstr->m_block;
  if (block == (BasicBlock *)0x0) {
    block = BasicBlock::New(this);
    IR::LabelInstr::SetBasicBlock(labelInstr,block);
  }
  if ((labelInstr->field_0x78 & 1) != 0) {
    block->field_0x18 = block->field_0x18 | 4;
    this->hasLoop = true;
  }
  return block;
}

Assistant:

BasicBlock *
FlowGraph::SetBlockTargetAndLoopFlag(IR::LabelInstr * labelInstr)
{
    BasicBlock * blockTarget = nullptr;
    blockTarget = labelInstr->GetBasicBlock();

    if (blockTarget == nullptr)
    {
        blockTarget = BasicBlock::New(this);
        labelInstr->SetBasicBlock(blockTarget);
    }
    if (labelInstr->m_isLoopTop)
    {
        blockTarget->isLoopHeader = true;
        this->hasLoop = true;
    }

    return blockTarget;
}